

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O3

Tensor<double> * __thiscall
scp::Tensor<double>::operator=(Tensor<double> *this,Tensor<double> *tensor)

{
  uint64_t uVar1;
  uint64_t *__s2;
  ulong uVar2;
  int iVar3;
  uint64_t *puVar4;
  double *pdVar5;
  unsigned_long __n2;
  long lVar6;
  ulong uVar7;
  uint64_t uVar8;
  
  uVar1 = (this->_shape).order;
  if ((uVar1 == (tensor->_shape).order) && (uVar8 = this->_length, uVar8 == tensor->_length)) {
    if (uVar1 != 0) {
      puVar4 = (this->_shape).sizes;
      __s2 = (tensor->_shape).sizes;
      iVar3 = bcmp(puVar4,__s2,uVar1 << 3);
      if (iVar3 != 0) {
        memmove(puVar4,__s2,uVar1 << 3);
        uVar8 = this->_length;
      }
    }
  }
  else {
    if (this->_owner == false) {
      __assert_fail("_owner",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                    ,0xe3,
                    "Tensor<TValue> &scp::Tensor<double>::operator=(const Tensor<TValue> &) [TValue = double]"
                   );
    }
    puVar4 = (this->_shape).sizes;
    if (puVar4 != (uint64_t *)0x0) {
      operator_delete__(puVar4);
    }
    if (this->_values != (double *)0x0) {
      operator_delete__(this->_values);
    }
    uVar2 = (tensor->_shape).order;
    (this->_shape).order = uVar2;
    if (uVar2 == 0) {
      iVar3 = 1;
    }
    else {
      iVar3 = 1;
      lVar6 = 0;
      do {
        iVar3 = iVar3 * (int)*(undefined8 *)((long)(tensor->_shape).sizes + lVar6);
        lVar6 = lVar6 + 8;
      } while (uVar2 * 8 - lVar6 != 0);
    }
    uVar8 = (uint64_t)iVar3;
    this->_length = uVar8;
    puVar4 = (uint64_t *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    (this->_shape).sizes = puVar4;
    uVar7 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar7 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar7);
    this->_values = pdVar5;
    this->_owner = true;
    if (uVar2 != 0) {
      memmove(puVar4,(tensor->_shape).sizes,uVar2 * 8);
    }
  }
  if (uVar8 != 0) {
    memmove(this->_values,tensor->_values,uVar8 << 3);
  }
  return this;
}

Assistant:

constexpr Tensor<TValue>& Tensor<TValue>::operator=(const Tensor<TValue>& tensor)
	{
		if (_shape.order != tensor._shape.order || _length != tensor._length)
		{
			assert(_owner);

			delete[] _shape.sizes;
			delete[] _values;

			_shape.order = tensor._shape.order;
			_length = std::accumulate(tensor._shape.sizes, tensor._shape.sizes + tensor._shape.order, 1, std::multiplies<uint64_t>());
			_shape.sizes = new uint64_t[_shape.order];
			_values = new TValue[_length];
			_owner = true;

			std::copy_n(tensor._shape.sizes, _shape.order, _shape.sizes);
		}
		else if (!std::equal(_shape.sizes, _shape.sizes + _shape.order, tensor._shape.sizes))
		{
			std::copy_n(tensor._shape.sizes, _shape.order, _shape.sizes);
		}

		std::copy_n(tensor._values, _length, _values);

		return *this;
	}